

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void fs_print_error(string_view path,string_view fname,error_code *ec)

{
  ostream *poVar1;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR: Ffilesystem:",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,fname._M_str,fname._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path._M_str,path._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")  ",3);
  if (ec->_M_value != 0) {
    (**(code **)(*(long *)ec->_M_cat + 0x20))(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  fs_emit_error();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void fs_print_error(std::string_view path, std::string_view fname, const std::error_code& ec)
{
  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path << ")  ";
  if(ec)
    std::cerr << ec.message();

  fs_emit_error();

  std::cerr << std::endl;
}